

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spot_light.cpp
# Opt level: O2

Light_SampleRes *
embree::SpotLight_sample
          (Light_SampleRes *__return_storage_ptr__,Light *super,DifferentialGeometry *dg,Vec2f *s)

{
  bool bVar1;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float local_28;
  float fStack_24;
  float fStack_20;
  
  fVar12 = (float)super[4].type - (dg->P).field_0.m128[0];
  fVar13 = (float)super[5].type - (dg->P).field_0.m128[1];
  fVar14 = (float)super[6].type - (dg->P).field_0.m128[2];
  fVar15 = (float)super[7].type - (dg->P).field_0.m128[3];
  if ((float)super[0x1a].type <= 0.0) {
    fVar7 = (float)super[0x10].type;
    fVar8 = (float)super[0x11].type;
    fVar9 = (float)super[0x12].type;
    bVar1 = false;
  }
  else {
    uniformSampleDisk((embree *)&local_28,(float)super[0x1a].type,s);
    fVar7 = (float)super[0x10].type;
    fVar8 = (float)super[0x11].type;
    fVar9 = (float)super[0x12].type;
    fVar12 = fVar12 + local_28 * (float)super[8].type +
                      fStack_24 * (float)super[0xc].type + fStack_20 * fVar7;
    fVar13 = fVar13 + local_28 * (float)super[9].type +
                      fStack_24 * (float)super[0xd].type + fStack_20 * fVar8;
    fVar14 = fVar14 + local_28 * (float)super[10].type +
                      fStack_24 * (float)super[0xe].type + fStack_20 * fVar9;
    fVar15 = fVar15 + local_28 * (float)super[0xb].type +
                      fStack_24 * (float)super[0xf].type + fStack_20 * (float)super[0x13].type;
    bVar1 = 0.0 < (float)super[0x1a].type;
  }
  fVar4 = fVar13 * fVar13;
  fVar5 = fVar14 * fVar14;
  fVar6 = fVar15 * fVar15;
  fVar10 = fVar4 + fVar12 * fVar12 + fVar5;
  fVar11 = fVar4 + fVar4 + fVar6;
  fVar5 = fVar4 + fVar5 + fVar5;
  fVar6 = fVar4 + fVar6 + fVar6;
  auVar2._4_4_ = fVar11;
  auVar2._0_4_ = fVar10;
  auVar2._8_4_ = fVar5;
  auVar2._12_4_ = fVar6;
  auVar3._4_4_ = fVar11;
  auVar3._0_4_ = fVar10;
  auVar3._8_4_ = fVar5;
  auVar3._12_4_ = fVar6;
  auVar3 = rsqrtss(auVar2,auVar3);
  fVar4 = auVar3._0_4_;
  fVar4 = fVar4 * fVar4 * fVar10 * -0.5 * fVar4 + fVar4 * 1.5;
  (__return_storage_ptr__->dir).field_0.m128[0] = fVar4 * fVar12;
  (__return_storage_ptr__->dir).field_0.m128[1] = fVar4 * fVar13;
  (__return_storage_ptr__->dir).field_0.m128[2] = fVar4 * fVar14;
  (__return_storage_ptr__->dir).field_0.m128[3] = fVar4 * fVar15;
  __return_storage_ptr__->dist = fVar10 * fVar4;
  fVar14 = fVar4 * fVar14 * fVar9 + fVar4 * fVar13 * fVar8 + fVar4 * fVar12 * fVar7;
  fVar12 = (float)super[0x18].type;
  fVar13 = (float)super[0x19].type;
  if (bVar1) {
    fVar15 = ABS(fVar14) * fVar10 * (float)super[0x1b].type;
  }
  else {
    fVar15 = INFINITY;
  }
  __return_storage_ptr__->pdf = fVar15;
  fVar13 = fVar13 * (-fVar14 - fVar12);
  if (1.0 <= fVar13) {
    fVar13 = 1.0;
  }
  fVar12 = 0.0;
  if (0.0 <= fVar13) {
    fVar12 = fVar13;
  }
  fVar12 = fVar4 * fVar4 * fVar12;
  fVar13 = (float)super[0x15].type;
  fVar14 = (float)super[0x16].type;
  fVar15 = (float)super[0x17].type;
  (__return_storage_ptr__->weight).field_0.m128[0] = fVar12 * (float)super[0x14].type;
  (__return_storage_ptr__->weight).field_0.m128[1] = fVar12 * fVar13;
  (__return_storage_ptr__->weight).field_0.m128[2] = fVar12 * fVar14;
  (__return_storage_ptr__->weight).field_0.m128[3] = fVar12 * fVar15;
  return __return_storage_ptr__;
}

Assistant:

SYCL_EXTERNAL Light_SampleRes SpotLight_sample(const Light* super,
                                                              const DifferentialGeometry& dg,
                                                              const Vec2f& s)
{
  const SpotLight* self = (SpotLight*)super;
  Light_SampleRes res;

  // extant light vector from the hit point
  res.dir = self->position - dg.P;

  if (self->radius > 0.0f)
    res.dir = self->frame * uniformSampleDisk(self->radius, s) + res.dir;

  const float dist2 = dot(res.dir, res.dir);
  const float invdist = rsqrt(dist2);

  // normalized light vector
  res.dir = res.dir * invdist;
  res.dist = dist2 * invdist;

  // cosine of the negated light direction and light vector.
  const float cosAngle = -dot(self->frame.vz, res.dir);
  const float angularAttenuation = clamp((cosAngle - self->cosAngleMax) * self->cosAngleScale);

  if (self->radius > 0.0f)
    res.pdf = self->diskPdf * dist2 * abs(cosAngle);
  else
    res.pdf = inf; // we always take this res

  // convert from power to radiance by attenuating by distance^2; attenuate by angle
  res.weight = self->power * (sqr(invdist) * angularAttenuation);

  return res;
}